

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void template_conformwords
               (t_template *tfrom,t_template *tto,int *conformaction,t_word *wfrom,t_word *wto)

{
  t_word tVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)tfrom->t_n;
  if (tfrom->t_n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    lVar4 = (long)*(int *)((long)&tto->t_pdobj + uVar3 * 4);
    if (-1 < lVar4) {
      tVar1 = wfrom[uVar3];
      wfrom[uVar3] = *(t_word *)(conformaction + lVar4 * 2);
      *(t_word *)(conformaction + (long)*(int *)((long)&tto->t_pdobj + uVar3 * 4) * 2) = tVar1;
    }
  }
  return;
}

Assistant:

static void template_conformwords(t_template *tfrom, t_template *tto,
    int *conformaction, t_word *wfrom, t_word *wto)
{
    int nfrom = tfrom->t_n, nto = tto->t_n, i;
    for (i = 0; i < nto; i++)
    {
        if (conformaction[i] >= 0)
        {
                /* we swap the two, in case it's an array or list, so that
                when "wfrom" is deleted the old one gets cleaned up. */
            t_word wwas = wto[i];
            wto[i] = wfrom[conformaction[i]];
            wfrom[conformaction[i]] = wwas;
        }
    }
}